

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O2

void __thiscall
trng::lagfib2plus<unsigned_int,_168U,_521U>::discard
          (lagfib2plus<unsigned_int,_168U,_521U> *this,unsigned_long_long n)

{
  unsigned_long_long uVar1;
  pointer puVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  anon_class_16_2_94731e0a f;
  vector_type V;
  matrix_type M;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  uVar1 = int_math::log2_ceil<unsigned_long_long>(n);
  if (uVar1 * 0x86de8d9 < n) {
    matrix<unsigned_int,_521UL>::matrix(&M);
    puVar2 = M.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    for (lVar3 = 1; lVar3 != 0x209; lVar3 = lVar3 + 1) {
      *puVar2 = 1;
      puVar2 = puVar2 + 0x20a;
    }
    M.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[0x42248] = 1;
    M.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[0x423a9] = 1;
    power<unsigned_int,521ul>
              ((matrix<unsigned_int,_521UL> *)&V,(trng *)&M,
               (matrix<unsigned_int,_521UL> *)(n - 0x209),1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&M.data,&V);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&V);
    vector<unsigned_int,_521UL>::vector(&V);
    for (lVar3 = 0; lVar3 != -0x209; lVar3 = lVar3 + -1) {
      V.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3 + 0x208] =
           (this->S).r[(this->S).index + (int)lVar3 & 0x3ff];
    }
    f.b = &V;
    f.a = &M;
    vector<unsigned_int,521ul>::operator*((vector<unsigned_int,521ul> *)&local_38,f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&V.data,&local_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
    uVar4 = (int)(matrix<unsigned_int,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar4 & 0x3ff;
    for (lVar3 = 0; lVar3 != -0x209; lVar3 = lVar3 + -1) {
      (this->S).r[uVar4 + (int)lVar3 & 0x3ff] =
           V.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar3 + 0x208];
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&V);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&M);
    n = 0x209;
  }
  while (bVar5 = n != 0, n = n - 1, bVar5) {
    step(this);
  }
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = B;
      using matrix_type = matrix<result_type, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * B * B * B};
      constexpr auto mask = int_math::mask(B);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = 1;
        M(matrix_size - 1, matrix_size - B) = 1;
        M(matrix_size - 1, matrix_size - A) = 1;
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        V = M * V;
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = V(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }